

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O1

void ConvertPopulationCountTableToBitEstimates
               (int num_symbols,uint32_t *population_counts,uint32_t *output)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  if (num_symbols < 1) {
    uVar5 = 0;
    bVar6 = true;
  }
  else {
    uVar3 = 0;
    uVar5 = 0;
    uVar4 = 0;
    do {
      uVar5 = uVar5 + population_counts[uVar3];
      uVar4 = (uVar4 + 1) - (uint)(population_counts[uVar3] == 0);
      uVar3 = uVar3 + 1;
    } while ((uint)num_symbols != uVar3);
    bVar6 = uVar4 < 2;
  }
  if (bVar6) {
    memset(output,0,(long)num_symbols << 2);
    return;
  }
  if (uVar5 < 0x100) {
    uVar1 = kLog2Table[uVar5];
  }
  else {
    uVar1 = (*VP8LFastLog2Slow)(uVar5);
  }
  if (0 < num_symbols) {
    uVar3 = 0;
    do {
      uVar5 = population_counts[uVar3];
      if ((ulong)uVar5 < 0x100) {
        uVar2 = kLog2Table[uVar5];
      }
      else {
        uVar2 = (*VP8LFastLog2Slow)(uVar5);
      }
      output[uVar3] = uVar1 - uVar2;
      uVar3 = uVar3 + 1;
    } while ((uint)num_symbols != uVar3);
  }
  return;
}

Assistant:

static void ConvertPopulationCountTableToBitEstimates(
    int num_symbols, const uint32_t population_counts[], uint32_t output[]) {
  uint32_t sum = 0;
  int nonzeros = 0;
  int i;
  for (i = 0; i < num_symbols; ++i) {
    sum += population_counts[i];
    if (population_counts[i] > 0) {
      ++nonzeros;
    }
  }
  if (nonzeros <= 1) {
    memset(output, 0, num_symbols * sizeof(*output));
  } else {
    const uint32_t logsum = VP8LFastLog2(sum);
    for (i = 0; i < num_symbols; ++i) {
      output[i] = logsum - VP8LFastLog2(population_counts[i]);
    }
  }
}